

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void copy_suite::unique_copy(void)

{
  initializer_list<int> __l;
  initializer_list<int> input;
  back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> __result;
  iterator second_begin;
  iterator second_end;
  iterator iVar1;
  iterator iVar2;
  allocator<int> local_fd;
  int local_fc [3];
  iterator local_f0;
  size_type local_e8;
  undefined1 local_e0 [8];
  vector<int,_std::allocator<int>_> expect;
  undefined1 local_98 [8];
  circular_view<int,_18446744073709551615UL> copy;
  int copy_array [4];
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  copy_array[2] = 0xb;
  copy_array[3] = 0x16;
  input._M_len = 6;
  input._M_array = copy_array + 2;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_98,
             (value_type (*) [4])&copy.member.next);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  __result = std::back_inserter<vista::circular_view<int,18446744073709551615ul>>
                       ((circular_view<int,_18446744073709551615UL> *)local_98);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                unique_copy<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>>
                          (iVar1,iVar2,__result);
  local_fc[0] = 0x21;
  local_fc[1] = 0x2c;
  local_fc[2] = 0x37;
  local_f0 = local_fc;
  local_e8 = 3;
  std::allocator<int>::allocator(&local_fd);
  __l._M_len = local_e8;
  __l._M_array = local_f0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_e0,__l,&local_fd);
  std::allocator<int>::~allocator(&local_fd);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_98);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_98);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_e0);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_e0);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xc9,"void copy_suite::unique_copy()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e0);
  return;
}

Assistant:

void unique_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55, 55 };
    int copy_array[4];
    circular_view<int> copy(copy_array);
    std::unique_copy(span.begin(), span.end(), std::back_inserter(copy));
    {
        std::vector<int> expect = { 33, 44, 55 };
        BOOST_TEST_ALL_EQ(copy.begin(), copy.end(),
                          expect.begin(), expect.end());
    }
}